

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::Delay3Syntax::setChild(Delay3Syntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00535b08 + *(int *)(&DAT_00535b08 + index * 4)))();
  return;
}

Assistant:

void Delay3Syntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: hash = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: delay1 = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: comma1 = child.token(); return;
        case 4: delay2 = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 5: comma2 = child.token(); return;
        case 6: delay3 = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 7: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}